

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

Pass * wasm::createDAEOptimizingPass(void)

{
  DAE *this;
  DAE *ret;
  
  this = (DAE *)operator_new(0x98);
  memset(this,0,0x98);
  DAE::DAE(this);
  this->optimize = true;
  return &this->super_Pass;
}

Assistant:

Pass* createDAEOptimizingPass() {
  auto* ret = new DAE();
  ret->optimize = true;
  return ret;
}